

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

void __thiscall ON_FontList::Internal_EmptyLists(ON_FontList *this)

{
  ON_FontList *this_local;
  
  ON_SimpleArray<const_ON_Font_*>::SetCount(&this->m_by_index,0);
  ON_SimpleArray<const_ON_Font_*>::SetCount(&this->m_unsorted,0);
  ON_SimpleArray<const_ON_Font_*>::SetCount(&this->m_sorted->m_by_font_characteristics_hash,0);
  ON_SimpleArray<const_ON_Font_*>::SetCount(&this->m_sorted->m_by_postscript_name,0);
  ON_SimpleArray<const_ON_Font_*>::SetCount(&this->m_sorted->m_by_windows_logfont_name,0);
  ON_SimpleArray<const_ON_Font_*>::SetCount(&this->m_sorted->m_by_family_name,0);
  ON_SimpleArray<const_ON_Font_*>::SetCount(&this->m_sorted->m_by_english_postscript_name,0);
  ON_SimpleArray<const_ON_Font_*>::SetCount(&this->m_sorted->m_by_english_windows_logfont_name,0);
  ON_SimpleArray<const_ON_Font_*>::SetCount(&this->m_sorted->m_by_english_family_name,0);
  ON_SimpleArray<const_ON_Font_*>::SetCount(&this->m_sorted->m_by_quartet_name,0);
  ON_ClassArray<ON_FontFaceQuartet>::Destroy(&this->m_quartet_list);
  return;
}

Assistant:

void ON_FontList::Internal_EmptyLists()
{
  m_by_index.SetCount(0);
  m_unsorted.SetCount(0);
  m_sorted.m_by_font_characteristics_hash.SetCount(0);
  m_sorted.m_by_postscript_name.SetCount(0);
  m_sorted.m_by_windows_logfont_name.SetCount(0);
  m_sorted.m_by_family_name.SetCount(0);
  m_sorted.m_by_english_postscript_name.SetCount(0);
  m_sorted.m_by_english_windows_logfont_name.SetCount(0);
  m_sorted.m_by_english_family_name.SetCount(0);
  m_sorted.m_by_quartet_name.SetCount(0);
  m_quartet_list.Destroy();
}